

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  pointer pcVar5;
  UnitTestImpl *pUVar6;
  _Alloc_hider name_00;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  const_iterator cVar9;
  long *plVar10;
  TestFactoryBase *factory;
  long *plVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string full_name;
  string message;
  char kMissingTestCase [348];
  char kMissingInstantiation [378];
  allocator local_431;
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  TestFactoryBase *local_3f0;
  undefined8 local_3e8;
  TestFactoryBase local_3e0;
  _func_int **pp_Stack_3d8;
  int local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  CodeLocation local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  _func_int **local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  TestFactoryBase *local_360;
  _func_int **local_358;
  TestFactoryBase local_350;
  _func_int **pp_Stack_348;
  int local_340;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  undefined1 local_318 [352];
  undefined1 local_1b8 [392];
  
  UnitTest::GetInstance();
  pUVar6 = UnitTest::GetInstance::instance.impl_;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t
                 ,name);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &(pUVar6->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header) {
    memcpy(local_1b8,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy(local_318,
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+(&local_3c8,"Parameterized test suite ",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3c8);
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_420 = *plVar11;
      lStack_418 = plVar10[3];
      local_430 = &local_420;
    }
    else {
      local_420 = *plVar11;
      local_430 = (long *)*plVar10;
    }
    local_428 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_430);
    paVar2 = &local_3a8.file.field_2;
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_3a8.file.field_2._M_allocated_capacity = *psVar12;
      local_3a8.file.field_2._8_8_ = plVar10[3];
      local_3a8.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_3a8.file.field_2._M_allocated_capacity = *psVar12;
      local_3a8.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3a8.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_3a8,(ulong)(name->_M_dataplus)._M_p);
    paVar1 = &local_410.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar13) {
      local_410.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_410.field_2._8_8_ = plVar10[3];
      local_410._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_410.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_410._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_410._M_string_length = plVar10[1];
    *plVar10 = (long)paVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_410);
    local_338 = &local_328;
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_328 = *plVar11;
      lStack_320 = plVar10[3];
    }
    else {
      local_328 = *plVar11;
      local_338 = (long *)*plVar10;
    }
    local_330 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_3a8.file._M_dataplus._M_p);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    std::operator+(&local_410,"UninstantiatedParameterizedTestSuite<",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_410);
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_3c8.field_2._M_allocated_capacity = *psVar12;
      local_3c8.field_2._8_8_ = plVar10[3];
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    }
    else {
      local_3c8.field_2._M_allocated_capacity = *psVar12;
      local_3c8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3c8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    name_00._M_p = local_3c8._M_dataplus._M_p;
    pcVar4 = (location->file)._M_dataplus._M_p;
    iVar3 = location->line;
    local_380 = &local_370;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_380,local_338,local_330 + (long)local_338);
    pcVar5 = (location->file)._M_dataplus._M_p;
    local_360 = &local_350;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar5,pcVar5 + (location->file)._M_string_length);
    local_340 = location->line;
    std::__cxx11::string::string((string *)&local_430,pcVar4,&local_431);
    local_3a8.file._M_dataplus._M_p = (pointer)&local_3a8.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,local_430,local_428 + (long)local_430);
    local_3a8.line = iVar3;
    factory = (TestFactoryBase *)operator_new(0x50);
    pp_Var8 = local_358;
    pp_Var7 = local_378;
    if (local_380 == &local_370) {
      local_410.field_2._8_8_ = local_370._8_8_;
      local_380 = paVar1;
    }
    local_410.field_2._M_allocated_capacity._1_7_ = local_370._M_allocated_capacity._1_7_;
    local_410.field_2._M_local_buf[0] = local_370._M_local_buf[0];
    local_378 = (_func_int **)0x0;
    local_370._M_local_buf[0] = '\0';
    if (local_360 == &local_350) {
      pp_Stack_3d8 = pp_Stack_348;
      local_360 = &local_3e0;
    }
    local_3e0._vptr_TestFactoryBase._1_7_ = local_350._vptr_TestFactoryBase._1_7_;
    local_3e0._vptr_TestFactoryBase._0_1_ = local_350._vptr_TestFactoryBase._0_1_;
    local_358 = (_func_int **)0x0;
    local_350._vptr_TestFactoryBase._0_1_ = 0;
    local_3d0 = local_340;
    factory->_vptr_TestFactoryBase =
         (_func_int **)
         (
         _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEbE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
         + 0x10);
    factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
    if (local_380 == paVar1) {
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_410.field_2._M_allocated_capacity;
      factory[4]._vptr_TestFactoryBase = (_func_int **)local_410.field_2._8_8_;
    }
    else {
      factory[1]._vptr_TestFactoryBase = (_func_int **)local_380;
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_410.field_2._M_allocated_capacity;
    }
    factory[2]._vptr_TestFactoryBase = pp_Var7;
    local_410._M_string_length = 0;
    local_410.field_2._M_allocated_capacity =
         (ulong)(uint7)local_370._M_allocated_capacity._1_7_ << 8;
    factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
    if (local_360 == &local_3e0) {
      factory[7]._vptr_TestFactoryBase = local_3e0._vptr_TestFactoryBase;
      factory[8]._vptr_TestFactoryBase = pp_Stack_3d8;
    }
    else {
      factory[5]._vptr_TestFactoryBase = (_func_int **)local_360;
      factory[7]._vptr_TestFactoryBase = local_3e0._vptr_TestFactoryBase;
    }
    factory[6]._vptr_TestFactoryBase = pp_Var8;
    local_3e8 = 0;
    local_3e0._vptr_TestFactoryBase =
         (_func_int **)((ulong)local_350._vptr_TestFactoryBase._1_7_ << 8);
    *(int *)&factory[9]._vptr_TestFactoryBase = local_340;
    local_410._M_dataplus._M_p = (pointer)paVar1;
    local_3f0 = &local_3e0;
    local_380 = &local_370;
    local_360 = &local_350;
    MakeAndRegisterTestInfo
              ("GoogleTestVerification",name_00._M_p,(char *)0x0,(char *)0x0,&local_3a8,
               &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
               (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.file._M_dataplus._M_p != &local_3a8.file.field_2) {
      operator_delete(local_3a8.file._M_dataplus._M_p);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430);
    }
    if (local_360 != &local_350) {
      operator_delete(local_360);
    }
    if (local_380 != &local_370) {
      operator_delete(local_380);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    if (local_338 != &local_328) {
      operator_delete(local_338);
    }
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" + name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}